

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall PrintStatement::evaluate(PrintStatement *this,SymTab *symTab)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  int i;
  ulong uVar3;
  pointer ppEVar4;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> array;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> testlist;
  TypeDescriptor typeDescriptor;
  _Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> local_e0;
  pointer local_c8;
  _Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_> local_c0;
  string local_a8 [32];
  undefined1 local_88 [56];
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> local_50;
  types local_38;
  
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::vector
            ((vector<ExprNode_*,_std::allocator<ExprNode_*>_> *)&local_c0,&this->_testlist->_list);
  local_c8 = local_c0._M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar4 = local_c0._M_impl.super__Vector_impl_data._M_start; ppEVar4 != local_c8;
      ppEVar4 = ppEVar4 + 1) {
    iVar1 = (*(*ppEVar4)->_vptr_ExprNode[1])(*ppEVar4,symTab);
    TypeDescriptor::TypeDescriptor
              ((TypeDescriptor *)local_88,(TypeDescriptor *)CONCAT44(extraout_var,iVar1));
    if (local_38 == STRING) {
      std::__cxx11::string::string(local_a8,(string *)(local_88 + 0x10));
      poVar2 = std::operator<<((ostream *)&std::cout,local_a8);
      poVar2 = std::operator<<(poVar2," ");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string(local_a8);
    }
    else if (local_38 == NUMBER) {
      poVar2 = std::ostream::_M_insert<double>((double)local_88._8_8_);
      poVar2 = std::operator<<(poVar2," ");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector
                ((vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)&local_e0,&local_50)
      ;
      std::operator<<((ostream *)&std::cout,"[");
      if ((*local_e0._M_impl.super__Vector_impl_data._M_start)->_type == NUMBER) {
        for (uVar3 = 0;
            uVar3 < (ulong)((long)local_e0._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_e0._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar3 = uVar3 + 1) {
          if (uVar3 != 0) {
            std::operator<<((ostream *)&std::cout,", ");
          }
          std::ostream::_M_insert<double>
                    (local_e0._M_impl.super__Vector_impl_data._M_start[uVar3]->_number);
        }
      }
      else {
        for (uVar3 = 0;
            uVar3 < (ulong)((long)local_e0._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_e0._M_impl.super__Vector_impl_data._M_start >> 3);
            uVar3 = uVar3 + 1) {
          if (uVar3 != 0) {
            std::operator<<((ostream *)&std::cout,", ");
          }
          std::__cxx11::string::string
                    (local_a8,(string *)
                              &local_e0._M_impl.super__Vector_impl_data._M_start[uVar3]->_string);
          std::operator<<((ostream *)&std::cout,local_a8);
          std::__cxx11::string::~string(local_a8);
        }
      }
      std::operator<<((ostream *)&std::cout,"]");
      std::_Vector_base<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::~_Vector_base
                (&local_e0);
    }
    TypeDescriptor::~TypeDescriptor((TypeDescriptor *)local_88);
  }
  std::_Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>::~_Vector_base(&local_c0);
  return;
}

Assistant:

void PrintStatement::evaluate(SymTab &symTab) {
    //std::cout << "----PRINT-START---- \n";
    std::vector<ExprNode*>testlist = testList()->getTestlist();
    for (ExprNode *exprNode : testlist) {
        TypeDescriptor typeDescriptor = *exprNode->evaluate(symTab);
        if(typeDescriptor.type() == TypeDescriptor::NUMBER)
            std::cout << typeDescriptor.getNumber() << " " << std::endl;
        else if(typeDescriptor.type() == TypeDescriptor::STRING)
            std::cout << typeDescriptor.getString() << " " << std::endl;
        else { //ARRAY
            std::vector<TypeDescriptor*>array = typeDescriptor.getArray();
            std::cout << "[";
            if(array[0]->type() == TypeDescriptor::NUMBER) {
                for (int i = 0; i < array.size(); i++) {
                    if(i != 0) std::cout << ", ";
                    std::cout << array[i]->getNumber();
                }
            } else{ // String Elements
                for (int i = 0; i < array.size(); i++) {
                    if(i != 0) std::cout << ", ";
                    std::cout << array[i]->getString();
                }
            }
            std::cout << "]";//<< std::endl;
        }
    }
    //std::cout << "-----PRINT-END----- \n";
}